

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O1

void __thiscall
llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::dump
          (DWARFListTableBase<llvm::DWARFDebugRnglist> *this,raw_ostream *OS,
          function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)>
          LookupPooledAddress,DIDumpOptions DumpOpts)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)> LookupPooledAddress_00
  ;
  _func_Optional<llvm::object::SectionedAddress>_intptr_t_uint *p_Var3;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *pDVar4;
  raw_ostream *prVar5;
  _Rb_tree_node_base *p_Var6;
  RangeListEntry *Entry_1;
  ulong uVar7;
  RangeListEntry *this_00;
  RangeListEntry *Entry;
  _Base_ptr p_Var8;
  StringRef SVar9;
  uint64_t local_78;
  uint64_t CurrentBase;
  intptr_t local_68;
  _Base_ptr local_60;
  _func_Optional<llvm::object::SectionedAddress>_intptr_t_uint *local_58;
  raw_ostream *local_50;
  _Base_ptr local_48;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *local_40;
  uint local_34;
  
  local_68 = LookupPooledAddress.callable;
  local_58 = LookupPooledAddress.callback;
  local_50 = OS;
  DWARFListTableHeader::dump(&this->Header,OS,DumpOpts);
  prVar5 = raw_ostream::operator<<(OS,this->HeaderString);
  SVar9.Length = 1;
  SVar9.Data = "\n";
  raw_ostream::operator<<(prVar5,SVar9);
  local_40 = this;
  if (DumpOpts.Verbose == true) {
    p_Var6 = (this->ListMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->ListMap)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      uVar7 = 0;
      do {
        p_Var2 = p_Var6[1]._M_left;
        for (p_Var8 = p_Var6[1]._M_parent; p_Var8 != p_Var2;
            p_Var8 = (_Base_ptr)&p_Var8[1]._M_parent) {
          SVar9 = dwarf::RangeListEncodingString((uint)*(byte *)&p_Var8->_M_parent);
          if (uVar7 <= SVar9.Length) {
            uVar7 = SVar9.Length;
          }
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
      goto LAB_00d71841;
    }
  }
  uVar7 = 0;
LAB_00d71841:
  pDVar4 = local_40;
  prVar5 = local_50;
  p_Var3 = local_58;
  local_78 = 0;
  local_60 = (local_40->ListMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48 = &(local_40->ListMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_60 != local_48) {
    local_34 = (uint)uVar7 & 0xff;
    do {
      this_00 = (RangeListEntry *)local_60[1]._M_parent;
      CurrentBase = (uint64_t)local_60[1]._M_left;
      if (this_00 != (RangeListEntry *)CurrentBase) {
        do {
          LookupPooledAddress_00.callable = local_68;
          LookupPooledAddress_00.callback = p_Var3;
          RangeListEntry::dump
                    (this_00,prVar5,(pDVar4->Header).HeaderData.AddrSize,(uint8_t)uVar7,&local_78,
                     DumpOpts,LookupPooledAddress_00);
          this_00 = this_00 + 1;
        } while (this_00 != (RangeListEntry *)CurrentBase);
      }
      local_60 = (_Base_ptr)std::_Rb_tree_increment(local_60);
    } while (local_60 != local_48);
  }
  return;
}

Assistant:

void DWARFListTableBase<DWARFListType>::dump(
    raw_ostream &OS,
    llvm::function_ref<Optional<object::SectionedAddress>(uint32_t)>
        LookupPooledAddress,
    DIDumpOptions DumpOpts) const {
  Header.dump(OS, DumpOpts);
  OS << HeaderString << "\n";

  // Determine the length of the longest encoding string we have in the table,
  // so we can align the output properly. We only need this in verbose mode.
  size_t MaxEncodingStringLength = 0;
  if (DumpOpts.Verbose) {
    for (const auto &List : ListMap)
      for (const auto &Entry : List.second.getEntries())
        MaxEncodingStringLength =
            std::max(MaxEncodingStringLength,
                     dwarf::RangeListEncodingString(Entry.EntryKind).size());
  }

  uint64_t CurrentBase = 0;
  for (const auto &List : ListMap)
    for (const auto &Entry : List.second.getEntries())
      Entry.dump(OS, getAddrSize(), MaxEncodingStringLength, CurrentBase,
                 DumpOpts, LookupPooledAddress);
}